

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseVar(WastParser *this,Var *out_var)

{
  Location loc;
  string_view name;
  TokenType TVar1;
  Result RVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar3;
  uint64_t index;
  Token token;
  uint64_t local_b0;
  Token local_a8;
  undefined1 local_68 [32];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  undefined1 local_28 [8];
  
  TVar1 = Peek(this,0);
  if (TVar1 == Last_Literal) {
    Consume(&local_a8,this);
    if (2 < local_a8.token_type_ - First_Literal) {
      __assert_fail("HasLiteral()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/token.h"
                    ,0x6a,"const Literal &wabt::Token::literal() const");
    }
    local_b0 = 0xffffffff;
    RVar2 = ParseUint64(local_a8.field_2.literal_.text.data_,
                        local_a8.field_2.literal_.text.data_ + local_a8.field_2.literal_.text.size_,
                        &local_b0);
    if (RVar2.enum_ == Error) {
      loc.filename.size_._0_4_ = (undefined4)local_a8.loc.filename.size_;
      loc.filename.data_ = local_a8.loc.filename.data_;
      loc.filename.size_._4_4_ = local_a8.loc.filename.size_._4_4_;
      loc.field_1.field_0.line = local_a8.loc.field_1.field_0.line;
      loc.field_1.field_0.first_column = local_a8.loc.field_1.field_0.first_column;
      loc.field_1.field_0.last_column = local_a8.loc.field_1.field_0.last_column;
      loc.field_1._12_4_ = local_a8.loc.field_1._12_4_;
      Error(this,loc,"invalid int \"%.*s\"",local_a8.field_2.literal_.text.size_ & 0xffffffff,
            local_a8.field_2.text_.size_,in_R8,in_R9);
    }
    Var::Var((Var *)local_68,(Index)local_b0,&local_a8.loc);
  }
  else {
    TVar1 = Peek(this,0);
    if (TVar1 != Last_String) {
      local_68._0_8_ = local_68 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"a numeric index","");
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"a name","");
      local_a8.loc.filename.data_ = (char *)0x0;
      local_a8.loc.filename.size_ = 0;
      local_a8.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                 (string *)local_68,local_28);
      RVar2 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_a8,"12 or $foo");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a8);
      lVar3 = 0;
      do {
        if (local_38 + lVar3 != *(undefined1 **)((long)local_48 + lVar3)) {
          operator_delete(*(undefined1 **)((long)local_48 + lVar3));
        }
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != -0x40);
      return (Result)RVar2.enum_;
    }
    Consume(&local_a8,this);
    if (5 < local_a8.token_type_ - AlignEqNat) {
      __assert_fail("HasText()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/token.h"
                    ,0x5b,"string_view wabt::Token::text() const");
    }
    name.size_ = local_a8.field_2.text_.size_;
    name.data_ = local_a8.field_2.text_.data_;
    Var::Var((Var *)local_68,name,&local_a8.loc);
  }
  Var::operator=(out_var,(Var *)local_68);
  Var::~Var((Var *)local_68);
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseVar(Var* out_var) {
  WABT_TRACE(ParseVar);
  if (PeekMatch(TokenType::Nat)) {
    Token token = Consume();
    string_view sv = token.literal().text;
    uint64_t index = kInvalidIndex;
    if (Failed(ParseUint64(sv.begin(), sv.end(), &index))) {
      // Print an error, but don't fail parsing.
      Error(token.loc, "invalid int \"" PRIstringview "\"",
            WABT_PRINTF_STRING_VIEW_ARG(sv));
    }

    *out_var = Var(index, token.loc);
    return Result::Ok;
  } else if (PeekMatch(TokenType::Var)) {
    Token token = Consume();
    *out_var = Var(token.text(), token.loc);
    return Result::Ok;
  } else {
    return ErrorExpected({"a numeric index", "a name"}, "12 or $foo");
  }
}